

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::NavMoveRequestResolveWithPastTreeNode
               (ImGuiNavItemData *result,ImGuiTreeNodeStackData *tree_node_data)

{
  ImVec2 IVar1;
  ImGuiContext *pIVar2;
  ImGuiContext *g;
  bool bVar3;
  
  pIVar2 = GImGui;
  GImGui->NavMoveScoringItems = false;
  (pIVar2->LastItemData).ID = tree_node_data->ID;
  (pIVar2->LastItemData).InFlags = tree_node_data->InFlags & 0xffdfffff;
  IVar1 = (tree_node_data->NavRect).Max;
  (pIVar2->LastItemData).NavRect.Min = (tree_node_data->NavRect).Min;
  (pIVar2->LastItemData).NavRect.Max = IVar1;
  NavApplyItemToResult(result);
  pIVar2 = GImGui;
  GImGui->NavWindow->RootWindowForNav->NavPreferredScoringPosRel[GImGui->NavLayer].y = 3.4028235e+38
  ;
  bVar3 = true;
  if (pIVar2->NavMoveScoringItems == false) {
    bVar3 = pIVar2->NavInitRequest;
  }
  pIVar2->NavAnyRequest = bVar3;
  return;
}

Assistant:

void ImGui::NavMoveRequestResolveWithPastTreeNode(ImGuiNavItemData* result, ImGuiTreeNodeStackData* tree_node_data)
{
    ImGuiContext& g = *GImGui;
    g.NavMoveScoringItems = false;
    g.LastItemData.ID = tree_node_data->ID;
    g.LastItemData.InFlags = tree_node_data->InFlags & ~ImGuiItemFlags_HasSelectionUserData; // Losing SelectionUserData, recovered next-frame (cheaper).
    g.LastItemData.NavRect = tree_node_data->NavRect;
    NavApplyItemToResult(result); // Result this instead of implementing a NavApplyPastTreeNodeToResult()
    NavClearPreferredPosForAxis(ImGuiAxis_Y);
    NavUpdateAnyRequestFlag();
}